

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

void __thiscall google::protobuf::io::Tokenizer::ConsumeLineComment(Tokenizer *this,string *content)

{
  if (content != (string *)0x0) {
    this->record_target_ = content;
    this->record_start_ = this->buffer_pos_;
  }
  do {
    if (this->current_char_ == '\0') {
LAB_00308c85:
      if (content != (string *)0x0) {
        if (this->buffer_pos_ != this->record_start_) {
          std::__cxx11::string::append
                    ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
        }
        this->record_target_ = (string *)0x0;
        this->record_start_ = -1;
      }
      return;
    }
    if (this->current_char_ == '\n') {
      NextChar(this);
      goto LAB_00308c85;
    }
    NextChar(this);
  } while( true );
}

Assistant:

void Tokenizer::ConsumeLineComment(std::string* content) {
  if (content != NULL) RecordTo(content);

  while (current_char_ != '\0' && current_char_ != '\n') {
    NextChar();
  }
  TryConsume('\n');

  if (content != NULL) StopRecording();
}